

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_level_csv_actions::module2(module_level_csv_actions *this,string *module,int level)

{
  ostream *poVar1;
  int level_local;
  string *module_local;
  module_level_csv_actions *this_local;
  
  if ((this->module2_start_ & 1U) == 0) {
    std::operator<<((ostream *)&std::cout," ");
  }
  else {
    this->module2_start_ = false;
  }
  std::operator<<((ostream *)&std::cout,(string *)module);
  if (level < 0x3fffffff) {
    poVar1 = std::operator<<((ostream *)&std::cout,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,level);
    std::operator<<(poVar1,")");
  }
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        if( module2_start_ )
        {
            module2_start_ = false;
        }
        else
        {
            std::cout << " ";
        }

        std::cout << module;

        if( level < unknown_level )
        {
            std::cout << "(" << level << ")";
        }
    }